

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OoutFormat.cpp
# Opt level: O0

string * __thiscall
oout::OoutFormat::error(string *__return_storage_ptr__,OoutFormat *this,string *text)

{
  string *text_local;
  OoutFormat *this_local;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)text);
  return __return_storage_ptr__;
}

Assistant:

string OoutFormat::error(const string &text) const
{
	return text;
}